

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

AggregateFunctionSet * duckdb::MedianFun::GetFunctions(void)

{
  AggregateFunction *in_RDI;
  AggregateFunctionSet *set;
  AggregateFunction *this;
  LogicalTypeId in_stack_fffffffffffffe4f;
  LogicalType *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe68;
  AggregateFunctionSet *in_stack_fffffffffffffe70;
  LogicalType *in_stack_ffffffffffffff28;
  LogicalType *in_stack_ffffffffffffff30;
  LogicalType *in_stack_ffffffffffffff38;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  this = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"median",&local_31);
  AggregateFunctionSet::AggregateFunctionSet(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
  LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
  LogicalType::LogicalType(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
  EmptyQuantileFunction<duckdb::MedianFunction>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  FunctionSet<duckdb::AggregateFunction>::AddFunction
            ((FunctionSet<duckdb::AggregateFunction> *)this,in_RDI);
  AggregateFunction::~AggregateFunction(this);
  LogicalType::~LogicalType((LogicalType *)0x1caedec);
  LogicalType::~LogicalType((LogicalType *)0x1caedf6);
  LogicalType::~LogicalType((LogicalType *)0x1caee00);
  return (AggregateFunctionSet *)this;
}

Assistant:

AggregateFunctionSet MedianFun::GetFunctions() {
	AggregateFunctionSet set("median");
	set.AddFunction(EmptyQuantileFunction<MedianFunction>(LogicalType::ANY, LogicalType::ANY, LogicalTypeId::INVALID));
	return set;
}